

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall
v_array<recall_tree_ns::node>::resize(v_array<recall_tree_ns::node> *this,size_t length)

{
  node *pnVar1;
  ostream *poVar2;
  vw_exception *this_00;
  long lVar3;
  long lVar4;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  pnVar1 = this->_begin;
  if (((long)this->end_array - (long)pnVar1) / 0x58 != length) {
    lVar4 = (long)this->_end - (long)pnVar1;
    pnVar1 = (node *)realloc(pnVar1,length * 0x58);
    if (length * 0x58 != 0 && pnVar1 == (node *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar2 = std::operator<<(&local_1a8,"realloc of ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2," failed in resize().  out of memory?");
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/v_array.h"
                 ,0x45,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    this->_begin = pnVar1;
    if ((pnVar1 != (node *)0x0) &&
       (lVar3 = length - lVar4 / 0x58, (ulong)(lVar4 / 0x58) <= length && lVar3 != 0)) {
      memset((void *)(lVar4 + (long)pnVar1),0,lVar3 * 0x58);
    }
    this->_end = (node *)(lVar4 + (long)pnVar1);
    this->end_array = pnVar1 + length;
  }
  return;
}

Assistant:

void resize(size_t length)
  {
    if ((size_t)(end_array - _begin) != length)
    {
      size_t old_len = _end - _begin;
      T* temp = (T*)realloc(_begin, sizeof(T) * length);
      if ((temp == nullptr) && ((sizeof(T) * length) > 0))
      {
        THROW("realloc of " << length << " failed in resize().  out of memory?");
      }
      else
        _begin = temp;
      if (old_len < length && _begin + old_len != nullptr)
        memset(_begin + old_len, 0, (length - old_len) * sizeof(T));
      _end = _begin + old_len;
      end_array = _begin + length;
    }
  }